

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

long days_untill_year(uint32_t year)

{
  bool bVar1;
  int iVar2;
  undefined4 local_1c;
  int days_in_the_year;
  int y;
  long days;
  uint32_t year_local;
  
  _days_in_the_year = 0;
  for (local_1c = 0x7b2; local_1c != year; local_1c = local_1c + 1) {
    bVar1 = leapyear(local_1c);
    iVar2 = 0x16d;
    if (bVar1) {
      iVar2 = 0x16e;
    }
    _days_in_the_year = iVar2 + _days_in_the_year;
  }
  return _days_in_the_year;
}

Assistant:

long days_untill_year(uint32_t year)
{
	long days{ 0 };
	int y{ 1970 };
	while (y != year)
	{
		auto days_in_the_year = leapyear(y) ? 366 : 365;
		days += days_in_the_year;
		++y;
	}
	return days;
}